

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpEnableWebserver(int enable)

{
  int iVar1;
  
  iVar1 = -0x74;
  if (UpnpSdkInit == 1) {
    if (enable == 0) {
      web_server_destroy();
      bWebServerState = WEB_SERVER_DISABLED;
      iVar1 = 0;
      SetHTTPGetCallback((MiniServerCallback)0x0);
    }
    else {
      iVar1 = web_server_init();
      if (iVar1 == 0) {
        bWebServerState = WEB_SERVER_ENABLED;
        SetHTTPGetCallback(web_server_callback);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int UpnpEnableWebserver(int enable)
{
	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}
#ifdef INTERNAL_WEB_SERVER
	if (enable) {
		int retVal = web_server_init();
		if (retVal != UPNP_E_SUCCESS) {
			return retVal;
		}
		bWebServerState = WEB_SERVER_ENABLED;
		SetHTTPGetCallback(web_server_callback);
	} else {
		web_server_destroy();
		bWebServerState = WEB_SERVER_DISABLED;
		SetHTTPGetCallback(NULL);
	}

	return UPNP_E_SUCCESS;
#else  /* Internal web server disabled */
	return UPNP_E_NO_WEB_SERVER;
#endif /* INTERNAL_WEB_SERVER */
}